

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int send_stream_control_frames(quicly_conn_t *conn,quicly_send_context_t *s)

{
  quicly_stream_t *stream;
  st_quicly_linklist_t **ppsVar1;
  ushort uVar2;
  uint uVar3;
  st_quicly_linklist_t *psVar4;
  st_quicly_linklist_t *psVar5;
  st_quicly_linklist_t *psVar6;
  int iVar7;
  uint8_t *puVar8;
  uint64_t v;
  quicly_sent_t *sent;
  st_quicly_linklist_t *local_38;
  
  local_38 = &(conn->egress).pending_streams.control;
  while ((s->num_datagrams != s->max_datagrams && (local_38->prev != local_38))) {
    psVar4 = (conn->egress).pending_streams.control.next;
    stream = (quicly_stream_t *)(psVar4 + -0x10);
    if (*(int *)&psVar4[-4].next == 1) {
      iVar7 = prepare_stream_state_sender
                        (stream,(quicly_sender_state_t *)&psVar4[-4].next,s,0x11,on_ack_stop_sending
                        );
      if (iVar7 != 0) {
        return iVar7;
      }
      puVar8 = s->dst;
      psVar5 = psVar4[-0x10].next;
      uVar2 = *(ushort *)((long)&psVar4[-4].next + 4);
      *puVar8 = '\x05';
      puVar8 = ptls_encode_quicint(puVar8 + 1,(uint64_t)psVar5);
      puVar8 = ptls_encode_quicint(puVar8,(ulong)uVar2);
      s->dst = puVar8;
      ppsVar1 = &psVar4[-0x10].prev[0x3a].next;
      *ppsVar1 = (st_quicly_linklist_t *)((long)&(*ppsVar1)->prev + 1);
    }
    iVar7 = should_send_max_stream_data(stream);
    if (iVar7 != 0) {
      psVar5 = psVar4[-6].prev;
      uVar3 = *(uint *)&psVar4[2].prev;
      iVar7 = allocate_ack_eliciting_frame
                        ((quicly_conn_t *)psVar4[-0x10].prev,s,0x11,&sent,on_ack_max_stream_data);
      if (iVar7 != 0) {
        return iVar7;
      }
      v = (long)&psVar5->prev + (ulong)uVar3;
      puVar8 = s->dst;
      psVar5 = psVar4[-0x10].next;
      *puVar8 = '\x11';
      puVar8 = ptls_encode_quicint(puVar8 + 1,(uint64_t)psVar5);
      puVar8 = ptls_encode_quicint(puVar8,v);
      s->dst = puVar8;
      (sent->data).packet.packet_number = (uint64_t)psVar4[-0x10].next;
      quicly_maxsender_record
                ((quicly_maxsender_t *)&psVar4[-3].next,v,&(sent->data).max_stream_data.args);
      psVar5 = psVar4[-0x10].prev;
      psVar5[0x3d].prev = (st_quicly_linklist_t *)((long)&(psVar5[0x3d].prev)->prev + 1);
      if (psVar5[0x52].prev != (st_quicly_linklist_t *)0x0) {
        (*(code *)psVar5[0x52].prev)
                  (psVar5[0x52].next,
                   "{\"type\":\"max-stream-data-send\", \"time\":%lld, \"stream-id\":%d, \"maximum\":%llu}\n"
                   ,psVar5[0x9c].prev,*(undefined4 *)&psVar4[-0x10].next,v);
      }
    }
    if (*(int *)&psVar4[-3].prev == 1) {
      iVar7 = prepare_stream_state_sender
                        (stream,(quicly_sender_state_t *)(psVar4 + -3),s,0x19,on_ack_reset_stream);
      if (iVar7 != 0) {
        return iVar7;
      }
      puVar8 = s->dst;
      uVar2 = *(ushort *)((long)&psVar4[-3].prev + 4);
      psVar5 = psVar4[-0x10].next;
      psVar6 = psVar4[-10].next;
      *puVar8 = '\x04';
      puVar8 = ptls_encode_quicint(puVar8 + 1,(uint64_t)psVar5);
      puVar8 = ptls_encode_quicint(puVar8,(ulong)uVar2);
      puVar8 = ptls_encode_quicint(puVar8,(uint64_t)psVar6);
      s->dst = puVar8;
      psVar4[-0x10].prev[0x3a].prev =
           (st_quicly_linklist_t *)((long)&(psVar4[-0x10].prev[0x3a].prev)->prev + 1);
    }
    if (*(int *)&psVar4[-1].next == 1) {
      iVar7 = allocate_ack_eliciting_frame
                        (stream->conn,s,0x11,&sent,on_ack_stream_data_blocked_frame);
      if (iVar7 != 0) {
        return iVar7;
      }
      psVar5 = psVar4[-4].prev;
      (sent->data).packet.packet_number = (uint64_t)psVar4[-0x10].next;
      (sent->data).ack.range.end = (uint64_t)psVar5;
      puVar8 = s->dst;
      psVar6 = psVar4[-0x10].next;
      *puVar8 = '\x15';
      puVar8 = ptls_encode_quicint(puVar8 + 1,(uint64_t)psVar6);
      puVar8 = ptls_encode_quicint(puVar8,(uint64_t)psVar5);
      s->dst = puVar8;
      *(undefined4 *)&psVar4[-1].next = 2;
      psVar4[-0x10].prev[0x3f].prev =
           (st_quicly_linklist_t *)((long)&(psVar4[-0x10].prev[0x3f].prev)->prev + 1);
    }
    psVar5 = psVar4->prev;
    psVar6 = psVar4->next;
    psVar5->next = psVar6;
    psVar6->prev = psVar5;
    psVar4->next = psVar4;
    psVar4->prev = psVar4;
  }
  return 0;
}

Assistant:

static int send_stream_control_frames(quicly_conn_t *conn, quicly_send_context_t *s)
{
    int ret = 0;

    while (s->num_datagrams != s->max_datagrams && quicly_linklist_is_linked(&conn->egress.pending_streams.control)) {
        quicly_stream_t *stream =
            (void *)((char *)conn->egress.pending_streams.control.next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
        if ((ret = send_control_frames_of_stream(stream, s)) != 0)
            goto Exit;
        quicly_linklist_unlink(&stream->_send_aux.pending_link.control);
    }

Exit:
    return ret;
}